

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_> *
wasm::WATParser::structtype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
           *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  FieldsT *fields;
  ulong uVar4;
  _Alloc_hider _Var5;
  string_view expected;
  undefined1 local_d8 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  namedFields;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  string local_80;
  undefined1 local_60 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  _val;
  
  this = &ctx->in;
  expected._M_str = "struct";
  expected._M_len = 6;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 0x30) = '\x01';
    return __return_storage_ptr__;
  }
  fields<wasm::WATParser::ParseTypeDefsCtx>
            ((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
              *)local_d8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                     *)local_60,
                    (_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                     *)local_d8);
  if (_val.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
    namedFields.val.
    super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    .
    super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    ._48_8_ = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&namedFields.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               + 0x30),local_60,
               (undefined1 *)
               (_val.val.
                super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                .
                super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                ._M_u._0_8_ + (long)local_60));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
         = puVar1;
    if ((undefined8 *)
        namedFields.val.
        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
        ._48_8_ == &local_90) {
      *puVar1 = local_90;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x18) = uStack_88;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
           = namedFields.val.
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
             ._48_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x10) = local_90;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 8) = local_98;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 0x30) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         *)local_60);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         *)local_60);
    bVar3 = Lexer::takeRParen(this);
    if (bVar3) {
      fields = (FieldsT *)0x0;
      if (namedFields.val.
          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
        fields = (FieldsT *)local_d8;
      }
      TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStruct
                ((StructT *)local_60,&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                 fields);
      std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>::pair
                ((pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *)
                 __return_storage_ptr__,
                 (pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *)
                 local_60);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x30) = '\0';
      if (_val.val.
          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          ._M_u._16_8_ != 0) {
        operator_delete((void *)_val.val.
                                super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                ._M_u._16_8_,
                        _val.val.
                        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        ._M_u._32_8_ -
                        _val.val.
                        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        ._M_u._16_8_);
      }
      if (local_60 == (undefined1  [8])0x0) goto LAB_00bbcd84;
      uVar4 = CONCAT71(_val.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       ._M_u._9_7_,
                       _val.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       ._M_u._M_first._M_storage._M_storage[8]) - (long)local_60;
      _Var5._M_p = (pointer)local_60;
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"expected end of struct definition","");
      Lexer::err((Err *)local_60,this,&local_80);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
           = puVar1;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&_val.val.
                          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                  + 8);
      if (local_60 == (undefined1  [8])paVar2) {
        *puVar1 = CONCAT71(_val.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           ._M_u._9_7_,
                           _val.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
         + 0x18) = _val.val.
                   super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             = local_60;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                  + 0x10) =
             CONCAT71(_val.val.
                      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      ._M_u._9_7_,
                      _val.val.
                      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 8) = _val.val.
              super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
              .
              super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              ._M_u._0_8_;
      _val.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._M_u._0_8_ = 0;
      _val.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x30) = '\x02';
      local_60 = (undefined1  [8])paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00bbcd84;
      uVar4 = local_80.field_2._M_allocated_capacity + 1;
      _Var5._M_p = local_80._M_dataplus._M_p;
    }
    operator_delete(_Var5._M_p,uVar4);
  }
LAB_00bbcd84:
  std::__detail::__variant::
  _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::StructT> structtype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("struct"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of struct definition");
  }

  return ctx.makeStruct(*namedFields);
}